

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_find_prev_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  long adr;
  ion_bpp_buffer_t *piVar1;
  ion_bpp_err_t iVar2;
  ion_bpp_key_t *__src;
  ion_bpp_buffer_t *buf;
  
  buf = *(ion_bpp_buffer_t **)((long)handle + 0xa8);
  if (buf == (ion_bpp_buffer_t *)0x0) {
    return bErrKeyNotFound;
  }
  if (*(undefined1 **)((long)handle + 0xb0) == &buf->p->fkey) {
    adr = buf->p->prev;
    if (adr == 0) {
      return bErrKeyNotFound;
    }
    iVar2 = readDisk(handle,adr,&buf);
    if (iVar2 != bErrOk) {
      return iVar2;
    }
    __src = &buf->p->fkey +
            (long)*(int *)((long)handle + 0xbc) * ((ulong)(*(ushort *)buf->p >> 1) - 1);
  }
  else {
    __src = *(undefined1 **)((long)handle + 0xb0) + -(long)*(int *)((long)handle + 0xbc);
  }
  piVar1 = buf;
  memcpy(key,__src,(long)*(int *)((long)handle + 8));
  *rec = *(ion_bpp_external_address_t *)(__src + *(int *)((long)handle + 8));
  *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar1;
  *(ion_bpp_key_t **)((long)handle + 0xb0) = __src;
  return bErrOk;
}

Assistant:

ion_bpp_err_t
b_find_prev_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_key_t		*pkey;			/* previous key */
	ion_bpp_key_t		*fkey;			/* first key */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	if ((buf = h->curBuf) == NULL) {
		return bErrKeyNotFound;
	}

	fkey = fkey(buf);

	if (h->curKey == fkey) {
		/* current key is first key in leaf node */
		if (prev(buf)) {
			/* fetch previous set */
			if ((rc = readDisk(handle, prev(buf), &buf)) != 0) {
				return rc;
			}

			pkey = fkey(buf) + ks((ct(buf) - 1));
		}
		else {
			/* no more sets */
			return bErrKeyNotFound;
		}
	}
	else {
		/* bump to previous key */
		pkey = h->curKey - ks(1);
	}

	memcpy(key, key(pkey), h->keySize);
	*rec		= rec(pkey);
	h->curBuf	= buf;
	h->curKey	= pkey;
	return bErrOk;
}